

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

void __thiscall AGSSock::Pool::run(Pool *this)

{
  Mutex *__mutex;
  __node_base *p_Var1;
  int iVar2;
  int *piVar3;
  _Node_iterator_base<AGSSock::Socket_*,_false> _Var4;
  uint __i;
  long lVar5;
  ssize_t sVar6;
  int *piVar7;
  _Node_iterator_base<AGSSock::Socket_*,_false> __readfds;
  _Node_iterator_base<AGSSock::Socket_*,_false> __it;
  __node_base *p_Var8;
  _Node_iterator<AGSSock::Socket_*,_true,_false> __tmp;
  ulong uVar9;
  int iVar10;
  Lock lock;
  int iStack_100dc;
  Sockets *__range3;
  fd_set read;
  char buffer [65536];
  
  iStack_100dc = (this->beacon_).data.fd[0];
  puts("\t\tThread started");
  __mutex = &this->guard_;
  p_Var1 = &(this->sockets_)._M_h._M_before_begin;
  do {
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      read.fds_bits[lVar5] = 0;
    }
    uVar9 = 1L << ((byte)iStack_100dc & 0x3f);
    read.fds_bits[iStack_100dc / 0x40] = read.fds_bits[iStack_100dc / 0x40] | uVar9;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    p_Var8 = p_Var1;
    iVar10 = iStack_100dc;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      iVar2 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt;
      read.fds_bits[iVar2 / 0x40] = read.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
      if (iVar10 <= iVar2) {
        iVar10 = iVar2;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __readfds._M_cur = (__node_type *)&read;
    select(iVar10 + 1,(fd_set *)__readfds._M_cur,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((read.fds_bits[iStack_100dc / 0x40] & uVar9) != 0) {
      AGSSockAPI::Beacon::reset(&this->beacon_);
      iStack_100dc = (this->beacon_).data.fd[0];
      puts("\t\tThread signalled");
    }
    __it._M_cur = (__node_type *)p_Var1->_M_nxt;
    while (iVar10 = (int)__readfds._M_cur, __it._M_cur != (__node_type *)0x0) {
      piVar3 = *(int **)((long)__it._M_cur + 8);
      iVar10 = *piVar3;
      if (((ulong)read.fds_bits[iVar10 / 0x40] >> ((long)iVar10 % 0x40 & 0x3fU) & 1) == 0) {
LAB_0010454f:
        __it._M_cur = *__it._M_cur;
      }
      else {
        __readfds._M_cur = (__node_type *)buffer;
        sVar6 = recv(iVar10,(__node_type *)buffer,0x10000,0);
        piVar7 = __errno_location();
        iVar10 = (int)sVar6;
        if (*piVar7 == 0xb && iVar10 == -1) {
          __it._M_cur = *__it._M_cur;
        }
        else {
          if (iVar10 == -1) {
            piVar3[0x26] = *piVar7;
          }
          else {
            if (piVar3[2] == 1) {
              __readfds._M_cur = (__node_type *)buffer;
              Buffer::append((Buffer *)(piVar3 + 0x12),buffer,(long)iVar10);
            }
            else {
              __readfds._M_cur = (__node_type *)buffer;
              Buffer::push((Buffer *)(piVar3 + 0x12),buffer,(long)iVar10);
            }
            if ((iVar10 != 0) || (piVar3[2] != 1)) goto LAB_0010454f;
          }
          _Var4._M_cur = *__it._M_cur;
          std::
          _Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::erase((_Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this,(const_iterator)__it._M_cur);
          __readfds._M_cur = __it._M_cur;
          __it._M_cur = _Var4._M_cur;
        }
      }
    }
    if ((this->sockets_)._M_h._M_element_count == 0) {
      puts("\t\tThread finished");
      AGSSockAPI::Thread::exit(&this->thread_,iVar10);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

void Pool::run()
{
	SOCKET signal = beacon_;
	fd_set read;
	int nfds;
	
	DEBUG_P("Thread started");
	for (;;) { /* event loop */
	
	// Reset FD sets
	FD_ZERO(&read);
	FD_SET(signal, &read);
	nfds = signal;
	
	// Add pool sockets to FD sets
	{
		Mutex::Lock lock(guard_);
		
		for (Socket *sock : sockets_)
		{
			FD_SET(sock->id, &read);
			// Windows ignores the nfds parameter, skip for efficiency
		#ifndef _WIN32
			if (nfds < sock->id)
				nfds = sock->id;
		#endif
		}
	}
	
	// Wait for events
	select(nfds + 1, &read, nullptr, nullptr, nullptr);
	// If select errs a socket was most likely closed locally, this is fine.
	// We need to check which one(s) and ignore all 'would block's.
	
	// Process read and error events
	{
		Mutex::Lock lock(guard_);
		
		if (FD_ISSET(signal, &read))
		{
			beacon_.reset();
			signal = beacon_;
			DEBUG_P("Thread signalled");
		}

		for (Sockets::iterator it = sockets_.begin(); it != sockets_.end();)
		{
			Socket *sock = *it;

			if (FD_ISSET(sock->id, &read))
			{
				char buffer[65536];
				int ret = recv(sock->id, buffer, sizeof (buffer), 0);
				int error = GET_ERROR();
				
				// We ignore sockets that would block:
				// This is normally filtered by select but a signal could have
				// interrupted select.
				if (ret == SOCKET_ERROR && WOULD_BLOCK(error))
				{
					++it;
					continue;
				}
				
				// If ret == 0 then closed gracefully (for TCP)
				// If ret == SOCKET_ERROR probably closed not so gracefully
				
				if (ret == SOCKET_ERROR)
					sock->incoming.error = error;
				else if (sock->type == SOCK_STREAM)
					sock->incoming.append(buffer, ret);
				else
					sock->incoming.push(buffer, ret);
				
				if ((ret == SOCKET_ERROR)
					|| (!ret && sock->type == SOCK_STREAM))
				{
					// This socket is done for, stop reading
					sockets_.erase(it++);
					continue;
				}	
			}

			++it;
		}
		
		// Close thread if there are no sockets to process anymore
		// Note: This is safe because the thread will be (re)started when
		//       sockets are added to the pool which requires the pool lock.
		if (sockets_.empty())
		{
			DEBUG_P("Thread finished");
			thread_.exit();
			return;
		}
	}
	
	} /* event loop */
	
	// Note: chaining the two critical sections might be more efficient as it
	// merges the loops, but this is not worth the hassle and might introduce
	// errors.
	
	DEBUG_P("Thread cancelled");
	thread_.exit();
	return;
}